

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O2

void __thiscall Contact::Contact(Contact *this,Contact *other)

{
  std::__cxx11::string::string((string *)this,(string *)other);
  if ((other->work_address)._M_t.super___uniq_ptr_impl<Address,_std::default_delete<Address>_>._M_t.
      super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
      super__Head_base<0UL,_Address_*,_false>._M_head_impl == (Address *)0x0) {
    (this->work_address)._M_t.super___uniq_ptr_impl<Address,_std::default_delete<Address>_>._M_t.
    super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
    super__Head_base<0UL,_Address_*,_false>._M_head_impl = (Address *)0x0;
  }
  else {
    std::make_unique<Address,Address&>((Address *)&this->work_address);
  }
  return;
}

Assistant:

Contact(const Contact& other)
		:	name{other.name},
			work_address{other.work_address ? std::make_unique<Address>(*other.work_address) : nullptr}
		{}